

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  Char CVar1;
  bool bVar2;
  bool local_31;
  bool local_1a;
  bool ok;
  Char c;
  Token *token_local;
  OurReader *this_local;
  
  skipSpaces(this);
  token->start_ = this->current_;
  CVar1 = getNextChar(this);
  local_1a = true;
  switch(CVar1) {
  case '\0':
    token->type_ = tokenEndOfStream;
    break;
  default:
    local_1a = false;
    break;
  case '\"':
    token->type_ = tokenString;
    local_1a = readString(this);
    break;
  case '\'':
    if (((this->features_).allowSingleQuotes_ & 1U) != 0) {
      token->type_ = tokenString;
      local_1a = readStringSingleQuote(this);
      break;
    }
  case '/':
    token->type_ = tokenComment;
    local_1a = readComment(this);
    break;
  case ',':
    token->type_ = tokenArraySeparator;
    break;
  case '-':
    bVar2 = readNumber(this,true);
    if (bVar2) {
      token->type_ = tokenNumber;
    }
    else {
      token->type_ = tokenNegInf;
      local_31 = false;
      if (((this->features_).allowSpecialFloats_ & 1U) != 0) {
        local_31 = match(this,"nfinity",7);
      }
      local_1a = local_31;
    }
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this,false);
    break;
  case ':':
    token->type_ = tokenMemberSeparator;
    break;
  case 'I':
    if (((this->features_).allowSpecialFloats_ & 1U) == 0) {
      local_1a = false;
    }
    else {
      token->type_ = tokenPosInf;
      local_1a = match(this,"nfinity",7);
    }
    break;
  case 'N':
    if (((this->features_).allowSpecialFloats_ & 1U) == 0) {
      local_1a = false;
    }
    else {
      token->type_ = tokenNaN;
      local_1a = match(this,"aN",2);
    }
    break;
  case '[':
    token->type_ = tokenArrayBegin;
    break;
  case ']':
    token->type_ = tokenArrayEnd;
    break;
  case 'f':
    token->type_ = tokenFalse;
    local_1a = match(this,"alse",4);
    break;
  case 'n':
    token->type_ = tokenNull;
    local_1a = match(this,"ull",3);
    break;
  case 't':
    token->type_ = tokenTrue;
    local_1a = match(this,"rue",3);
    break;
  case '{':
    token->type_ = tokenObjectBegin;
    break;
  case '}':
    token->type_ = tokenObjectEnd;
  }
  if (local_1a == false) {
    token->type_ = tokenError;
  }
  token->end_ = this->current_;
  return true;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
    token.type_ = tokenString;
    ok = readStringSingleQuote();
    break;
    } // else continue
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}